

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn_pacman_agent.hh
# Opt level: O0

void __thiscall NN_Pacman_Agent::NN_Pacman_Agent(NN_Pacman_Agent *this,string *neural_network_path)

{
  ostream *poVar1;
  size_type __n;
  allocator<double> local_111;
  vector<double,_std::allocator<double>_> local_110;
  char local_e8 [8];
  char str [200];
  string *neural_network_path_local;
  NN_Pacman_Agent *this_local;
  
  Agent::Agent(&this->super_Agent);
  (this->super_Agent)._vptr_Agent = (_func_int **)&PTR_take_action_0014ed28;
  Neural_Network::Neural_Network(&this->nn,neural_network_path,0.0);
  std::vector<double,_std::allocator<double>_>::vector(&this->input);
  if ((this->nn).n_inputs != RL_Pacman_Agent_Inputs::n_inputs) {
    sprintf(local_e8,"This neural network was trained with different inputs");
    poVar1 = std::operator<<((ostream *)&std::cout,"Error[");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/rl/nn_pacman_agent.hh"
                            );
    poVar1 = std::operator<<(poVar1,"][");
    poVar1 = std::operator<<(poVar1,"NN_Pacman_Agent");
    poVar1 = std::operator<<(poVar1,"][Line ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1a);
    poVar1 = std::operator<<(poVar1,"] ");
    poVar1 = std::operator<<(poVar1,local_e8);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  __n = (size_type)RL_Pacman_Agent_Inputs::n_inputs;
  std::allocator<double>::allocator(&local_111);
  std::vector<double,_std::allocator<double>_>::vector(&local_110,__n,&local_111);
  std::vector<double,_std::allocator<double>_>::operator=(&this->input,&local_110);
  std::vector<double,_std::allocator<double>_>::~vector(&local_110);
  std::allocator<double>::~allocator(&local_111);
  return;
}

Assistant:

NN_Pacman_Agent(string neural_network_path) : nn(neural_network_path, 0.0) {
        ensure(nn.n_inputs == uint(RL_Pacman_Agent_Inputs::n_inputs), "This neural network was trained with different inputs");
        input = vector<double>(RL_Pacman_Agent_Inputs::n_inputs);
    }